

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLoop5(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *this;
  FeatureType *pFVar2;
  ArrayFeatureType *this_00;
  GreaterThanLayerParams *this_01;
  NeuralNetworkLayer *pNVar3;
  ActivationParams *this_02;
  NeuralNetwork *pNVar4;
  ostream *poVar5;
  undefined1 local_168 [8];
  Result res;
  LoopLayerParams *loop_params;
  NeuralNetworkLayer *l3;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l2;
  NeuralNetwork nnBody;
  NeuralNetworkLayer *l1;
  NeuralNetwork nnCondition;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(this,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnCondition._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nnCondition._80_8_,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnCondition._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l1);
  nnBody._80_8_ = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l1);
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_greaterthan
                      ((NeuralNetworkLayer *)nnBody._80_8_);
  CoreML::Specification::GreaterThanLayerParams::set_alpha(this_01,1.0);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)nnBody._80_8_,"cond");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)nnBody._80_8_,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)nnBody._80_8_,"cond");
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l2);
  pNVar3 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l2);
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar3);
  CoreML::Specification::ActivationParams::mutable_relu(this_02);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar3,"relu");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar3,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar3,"B");
  pNVar4 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(pNVar4,EXACT_ARRAY_MAPPING);
  pNVar3 = CoreML::Specification::NeuralNetwork::add_layers(pNVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar3,"for_loop");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_loop(pNVar3);
  pNVar4 = CoreML::Specification::LoopLayerParams::mutable_bodynetwork
                     ((LoopLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar4,(NeuralNetwork *)&l2);
  pNVar4 = CoreML::Specification::LoopLayerParams::mutable_conditionnetwork
                     ((LoopLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar4,(NeuralNetwork *)&l1);
  CoreML::Specification::LoopLayerParams::set_conditionvar
            ((LoopLayerParams *)res.m_message.field_2._8_8_,"cond");
  CoreML::validate<(MLModelType)500>((Result *)local_168,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_168);
  if (m._oneof_case_[0]._0_1_) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1265);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_168);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l2);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l1);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLoop5() {
    /*
     output blob not generated outside the loop
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    Specification::NeuralNetwork nnCondition;
    auto *l1 = nnCondition.add_layers();
    l1->mutable_greaterthan()->set_alpha(1.0);
    l1->set_name("cond");
    l1->add_input("A");
    l1->add_output("cond");
    
    Specification::NeuralNetwork nnBody;
    auto *l2 = nnBody.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu");
    l2->add_input("A");
    l2->add_output("B");
    
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    
    auto *l3 = nnMain->add_layers();
    l3->set_name("for_loop");
    auto *loop_params = l3->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);
    loop_params->mutable_conditionnetwork()->CopyFrom(nnCondition);
    loop_params->set_conditionvar("cond");
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}